

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::ErrorOperator>
               (string_t *ldata,int *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  string_t *psVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Alloc_hider _Var3;
  size_type sVar4;
  ulong uVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  InvalidInputException *pIVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined4 *puVar11;
  ulong uVar12;
  unsigned_long uVar13;
  ulong uVar14;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string local_58;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = *(ulong *)&ldata->value;
      uStack_60 = *(undefined4 *)((long)&ldata->value + 8);
      uStack_5c = *(undefined4 *)((long)&ldata->value + 0xc);
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      if ((local_68 & 0xffffffff) < 0xd) {
        lVar9 = (long)&local_68 + 4;
      }
      else {
        lVar9 = CONCAT44(uStack_5c,uStack_60);
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,lVar9,(local_68 & 0xffffffff) + lVar9);
      InvalidInputException::InvalidInputException(pIVar7,&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_68 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_58,(unsigned_long **)mask,&local_68);
      sVar4 = local_58._M_string_length;
      _Var3._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var3._M_p;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar6->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar10 = 0;
      uVar8 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar13 = 0xffffffffffffffff;
        }
        else {
          uVar13 = puVar2[uVar8];
        }
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
        if (uVar13 == 0xffffffffffffffff) {
          uVar5 = uVar10;
          if (uVar10 < uVar12) {
            psVar1 = ldata + uVar10;
            local_68 = *(ulong *)&psVar1->value;
            uStack_60 = *(undefined4 *)((long)&psVar1->value + 8);
            uStack_5c = *(undefined4 *)((long)&psVar1->value + 0xc);
            pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            if ((local_68 & 0xffffffff) < 0xd) {
              lVar9 = (long)&local_68 + 4;
            }
            else {
              lVar9 = CONCAT44(uStack_5c,uStack_60);
            }
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,lVar9,(local_68 & 0xffffffff) + lVar9);
            InvalidInputException::InvalidInputException(pIVar7,&local_58);
            __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        }
        else {
          uVar5 = uVar12;
          if ((uVar13 != 0) && (uVar5 = uVar10, uVar10 < uVar12)) {
            puVar11 = (undefined4 *)((long)&ldata[uVar10].value + 8);
            uVar14 = 0;
            do {
              if ((uVar13 >> (uVar14 & 0x3f) & 1) != 0) {
                local_68 = *(ulong *)(puVar11 + -2);
                uStack_60 = *puVar11;
                uStack_5c = puVar11[1];
                pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                if ((local_68 & 0xffffffff) < 0xd) {
                  lVar9 = (long)&local_68 + 4;
                }
                else {
                  lVar9 = CONCAT44(uStack_5c,uStack_60);
                }
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,lVar9,(local_68 & 0xffffffff) + lVar9);
                InvalidInputException::InvalidInputException(pIVar7,&local_58);
                __cxa_throw(pIVar7,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              puVar11 = puVar11 + 4;
              uVar14 = uVar14 + 1;
              uVar5 = uVar12;
            } while (uVar12 - uVar10 != uVar14);
          }
        }
        uVar10 = uVar5;
        uVar8 = uVar8 + 1;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}